

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timestamp.cpp
# Opt level: O1

bool duckdb::Timestamp::TryFromDatetime(date_t date,dtime_tz_t timetz,timestamp_t *result)

{
  bool bVar1;
  
  bVar1 = TryFromDatetime(date,(dtime_t)(timetz.bits >> 0x18),result);
  if ((bVar1) &&
     (bVar1 = TryAddOperator::Operation<long,long,long>
                        (result->value,(0xe0ff - (ulong)((uint)timetz.bits & 0xffffff)) * -1000000,
                         &result->value), bVar1)) {
    return result->value != -0x7fffffffffffffff && result->value != 0x7fffffffffffffff;
  }
  return false;
}

Assistant:

bool Timestamp::TryFromDatetime(date_t date, dtime_tz_t timetz, timestamp_t &result) {
	if (!TryFromDatetime(date, timetz.time(), result)) {
		return false;
	}
	// Offset is in seconds
	const auto offset = int64_t(timetz.offset() * Interval::MICROS_PER_SEC);
	if (!TryAddOperator::Operation(result.value, -offset, result.value)) {
		return false;
	}
	return Timestamp::IsFinite(result);
}